

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_0::getOverlap
                  (uint16_t *p,int32_t length,uint16_t *q,int32_t qStart,int32_t blockLength)

{
  bool bVar1;
  byte local_2d;
  int local_2c;
  int32_t overlap;
  int32_t blockLength_local;
  int32_t qStart_local;
  uint16_t *q_local;
  int32_t length_local;
  uint16_t *p_local;
  
  local_2c = blockLength + -1;
  while( true ) {
    local_2d = 0;
    if (0 < local_2c) {
      bVar1 = equalBlocks(p + (length - local_2c),q + qStart,local_2c);
      local_2d = bVar1 ^ 0xff;
    }
    if ((local_2d & 1) == 0) break;
    local_2c = local_2c + -1;
  }
  return local_2c;
}

Assistant:

int32_t getOverlap(const uint16_t *p, int32_t length,
                   const uint16_t *q, int32_t qStart, int32_t blockLength) {
    int32_t overlap = blockLength - 1;
    U_ASSERT(overlap <= length);
    q += qStart;
    while (overlap > 0 && !equalBlocks(p + (length - overlap), q, overlap)) {
        --overlap;
    }
    return overlap;
}